

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printVectorIndex(MCInst *MI,uint OpNum,SStream *O)

{
  cs_detail *pcVar1;
  MCOperand *pMVar2;
  int64_t iVar3;
  
  SStream_concat0(O,"[");
  pMVar2 = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(pMVar2);
  printInt32(O,(int32_t)iVar3);
  SStream_concat0(O,"]");
  if (MI->csh->detail != CS_OPT_OFF) {
    pMVar2 = MCInst_getOperand(MI,OpNum);
    iVar3 = MCOperand_getImm(pMVar2);
    pcVar1 = MI->flat_insn->detail;
    *(int *)(pcVar1->regs_read + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 8) =
         (int)iVar3;
  }
  return;
}

Assistant:

static void printVectorIndex(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned tmp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "[0x%x]",tmp);
	else
		SStream_concat(O, "[%u]",tmp);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].vector_index = tmp;
	}
}